

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O0

void __thiscall NaPNStatistics::initialize(NaPNStatistics *this,bool *starter)

{
  uint uVar1;
  char *pcVar2;
  NaPetriNode *in_RDI;
  int id;
  int local_14;
  
  NaVector::init_zero((NaVector *)0x1513d4);
  NaVector::init_zero((NaVector *)0x1513e5);
  NaVector::init_zero((NaVector *)0x1513f6);
  NaVector::init_zero((NaVector *)0x151407);
  NaVector::init_zero((NaVector *)0x151418);
  NaVector::init_zero((NaVector *)0x151429);
  NaVector::init_zero((NaVector *)0x15143a);
  *(undefined4 *)&in_RDI[5].pcaPorts.pHead = 0;
  uVar1 = (*in_RDI->_vptr_NaPetriNode[3])();
  if ((uVar1 & 1) != 0) {
    if (*(int *)&in_RDI[5].pcaPorts.field_0xc == 0) {
      pcVar2 = NaPetriNode::name(in_RDI);
      NaPrintLog("Statistics node \'%s\' has continuous computation\n",pcVar2);
    }
    else {
      pcVar2 = NaPetriNode::name(in_RDI);
      NaPrintLog("Statistics node \'%s\' has floating gap %u computation\n",pcVar2,
                 (ulong)*(uint *)&in_RDI[5].pcaPorts.field_0xc);
    }
    if (((ulong)in_RDI[6].pcaPorts._vptr_NaDynAr & 0x3ff) == 0) {
      NaPrintLog("  and does not have halt conditions.\n");
    }
    else {
      NaPrintLog("  and has next halt conditions:\n");
      for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
        if ((*(uint *)&in_RDI[6].pcaPorts._vptr_NaDynAr & 1 << ((byte)local_14 & 0x1f)) != 0) {
          NaPrintLog((char *)(&in_RDI[6].pcaPorts.pHead)[(long)local_14 * 2],"  %s[0] %s %g\n",
                     szId[local_14],szSign[(&in_RDI[6].pcaPorts.nItems)[(long)local_14 * 4] + 1]);
        }
      }
    }
  }
  return;
}

Assistant:

void
NaPNStatistics::initialize (bool& starter)
{
    Mean.init_zero();
    RMS.init_zero();
    StdDev.init_zero();
    Min.init_zero();
    Max.init_zero();

    Sum.init_zero();
    Sum2.init_zero();

    nGapAct = 0;

    if(is_verbose()){
      if(nGapWidth)
	NaPrintLog("Statistics node '%s' has floating gap %u computation\n",
		   name(), nGapWidth);
      else
	NaPrintLog("Statistics node '%s' has continuous computation\n",
		   name());
      if(mHalt & NaSM_ALL){
	int	id;

	NaPrintLog("  and has next halt conditions:\n");
	for(id = 0; id < NaSI_number; ++id){
	  if(mHalt & NaSIdToMask(id))
	    NaPrintLog("  %s[0] %s %g\n", szId[id],
		       szSign[1 + HaltCond[id].sign], HaltCond[id].value);
	}
      }else
	NaPrintLog("  and does not have halt conditions.\n");
    }
}